

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

Read<double> __thiscall Omega_h::fabs_each(Omega_h *this,Read<double> *a)

{
  int *piVar1;
  Alloc *pAVar2;
  int iVar3;
  ulong uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar5;
  long lVar6;
  _Alloc_hider _Var7;
  size_t sVar8;
  undefined8 uVar9;
  Read<double> RVar10;
  type f;
  Write<double> b;
  string local_68;
  Write<double> local_48;
  Write<double> local_30;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar8 = pAVar2->size;
  }
  else {
    sVar8 = (ulong)pAVar2 >> 3;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  Write<double>::Write(&local_48,(LO)(sVar8 >> 3),&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)local_48.shared_alloc_.alloc;
  if (((ulong)local_48.shared_alloc_.alloc & 7) == 0 && local_48.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_68._M_dataplus._M_p = (pointer)((local_48.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_48.shared_alloc_.alloc)->use_count = (local_48.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68._M_string_length = (size_type)local_48.shared_alloc_.direct_ptr;
  pAVar2 = (a->write_).shared_alloc_.alloc;
  local_68.field_2._M_allocated_capacity = (size_type)pAVar2;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68.field_2._M_allocated_capacity = (size_type)(Alloc *)(pAVar2->size * 8 + 1);
    }
    else {
      pAVar2->use_count = pAVar2->use_count + 1;
    }
  }
  local_68.field_2._8_8_ = (a->write_).shared_alloc_.direct_ptr;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar4 = pAVar2->size;
  }
  else {
    uVar4 = (ulong)pAVar2 >> 3;
  }
  _Var7._M_p = local_68._M_dataplus._M_p;
  if (((ulong)local_68._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_68._M_dataplus._M_p != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      _Var7._M_p = (pointer)(*(long *)local_68._M_dataplus._M_p * 8 + 1);
    }
    else {
      *(int *)(local_68._M_dataplus._M_p + 0x30) = *(int *)(local_68._M_dataplus._M_p + 0x30) + 1;
    }
  }
  uVar9 = local_68.field_2._M_allocated_capacity;
  if ((local_68.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_68.field_2._M_allocated_capacity != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      uVar9 = (Alloc *)(*(long *)local_68.field_2._M_allocated_capacity * 8 + 1);
    }
    else {
      *(int *)(local_68.field_2._M_allocated_capacity + 0x30) =
           *(int *)(local_68.field_2._M_allocated_capacity + 0x30) + 1;
    }
  }
  iVar3 = (int)(uVar4 >> 3);
  if (0 < iVar3) {
    if (((ulong)_Var7._M_p & 7) == 0 && (Alloc *)_Var7._M_p != (Alloc *)0x0) {
      ((Alloc *)_Var7._M_p)->use_count = ((Alloc *)_Var7._M_p)->use_count + -1;
      _Var7._M_p = (pointer)(((Alloc *)_Var7._M_p)->size * 8 + 1);
    }
    if ((uVar9 & 7) == 0 && (Alloc *)uVar9 != (Alloc *)0x0) {
      ((Alloc *)uVar9)->use_count = ((Alloc *)uVar9)->use_count + -1;
      uVar9 = ((Alloc *)uVar9)->size * 8 + 1;
    }
    entering_parallel = '\0';
    lVar6 = 0;
    do {
      *(ulong *)((long)local_48.shared_alloc_.direct_ptr + lVar6 * 8) =
           *(ulong *)(local_68.field_2._8_8_ + lVar6 * 8) & 0x7fffffffffffffff;
      lVar6 = lVar6 + 1;
    } while (iVar3 != (int)lVar6);
    if ((uVar9 & 7) == 0 && (Alloc *)uVar9 != (Alloc *)0x0) {
      piVar1 = &((Alloc *)uVar9)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)uVar9);
        operator_delete((void *)uVar9,0x48);
      }
    }
    if (((ulong)_Var7._M_p & 7) == 0 && (Alloc *)_Var7._M_p != (Alloc *)0x0) {
      piVar1 = &((Alloc *)_Var7._M_p)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)_Var7._M_p);
        operator_delete(_Var7._M_p,0x48);
      }
    }
    _Var7._M_p = (pointer)0x0;
    uVar9 = (Alloc *)0x0;
  }
  if ((uVar9 & 7) == 0 && (Alloc *)uVar9 != (Alloc *)0x0) {
    piVar1 = &((Alloc *)uVar9)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)uVar9);
      operator_delete((void *)uVar9,0x48);
    }
  }
  if (((ulong)_Var7._M_p & 7) == 0 && (Alloc *)_Var7._M_p != (Alloc *)0x0) {
    piVar1 = &((Alloc *)_Var7._M_p)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)_Var7._M_p);
      operator_delete(_Var7._M_p,0x48);
    }
  }
  local_30.shared_alloc_.alloc = local_48.shared_alloc_.alloc;
  local_30.shared_alloc_.direct_ptr = local_48.shared_alloc_.direct_ptr;
  if ((((ulong)local_48.shared_alloc_.alloc & 7) == 0 &&
       local_48.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_48.shared_alloc_.alloc)->use_count = (local_48.shared_alloc_.alloc)->use_count + -1;
    local_30.shared_alloc_.alloc = (Alloc *)((local_48.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_48.shared_alloc_.alloc = (Alloc *)0x0;
  local_48.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this,&local_30);
  pAVar2 = local_30.shared_alloc_.alloc;
  pvVar5 = extraout_RDX;
  if (((ulong)local_30.shared_alloc_.alloc & 7) == 0 && local_30.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_30.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_30.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  uVar9 = local_68.field_2._M_allocated_capacity;
  if ((local_68.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_68.field_2._M_allocated_capacity != (Alloc *)0x0) {
    piVar1 = (int *)(local_68.field_2._M_allocated_capacity + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_68.field_2._M_allocated_capacity);
      operator_delete((void *)uVar9,0x48);
      pvVar5 = extraout_RDX_01;
    }
  }
  _Var7._M_p = local_68._M_dataplus._M_p;
  if (((ulong)local_68._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_68._M_dataplus._M_p != (Alloc *)0x0) {
    piVar1 = (int *)(local_68._M_dataplus._M_p + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_68._M_dataplus._M_p);
      operator_delete(_Var7._M_p,0x48);
      pvVar5 = extraout_RDX_02;
    }
  }
  pAVar2 = local_48.shared_alloc_.alloc;
  if (((ulong)local_48.shared_alloc_.alloc & 7) == 0 && local_48.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_48.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar5 = extraout_RDX_03;
    }
  }
  RVar10.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar10.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<double>)RVar10.write_.shared_alloc_;
}

Assistant:

Read<Real> fabs_each(Read<Real> a) {
  Write<Real> b(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { b[i] = std::abs(a[i]); };
  parallel_for(a.size(), f, "fabs_each");
  return b;
}